

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::ChromeCompositorSchedulerState::ParseFromArray
          (ChromeCompositorSchedulerState *this,void *raw,size_t size)

{
  byte bVar1;
  uint uVar2;
  undefined1 uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  bool bVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  uint *puVar14;
  uint uVar15;
  uint *in_R11;
  uint *puVar16;
  uint *puVar17;
  bool bVar18;
  Field local_68;
  uint *local_58;
  uint *local_50;
  ChromeCompositorSchedulerState *local_48;
  uint *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (uint *)(size + (long)raw);
  do {
    lVar7 = 7;
    if (puVar9 <= raw) goto LAB_00252182;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar16 = (uint *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar5 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar8 = puVar16;
      for (lVar6 = lVar7;
          (puVar13 = puVar8, uVar12 = uVar5, (char)bVar1 < '\0' &&
          (bVar18 = 0x38 < lVar6 - 7U, bVar10 = bVar18 || puVar9 <= puVar8, puVar13 = puVar16,
          uVar12 = 0, !bVar18 && puVar9 > puVar8)); lVar6 = lVar6 + 7) {
        bVar1 = (byte)*puVar8;
        in_R11 = (uint *)((ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f));
        puVar8 = (uint *)((long)puVar8 + 1);
        uVar5 = uVar5 | (ulong)in_R11;
      }
      puVar16 = puVar13;
      if (bVar10) {
        puVar16 = (uint *)raw;
        uVar12 = 0;
      }
      if (puVar16 == (uint *)raw) goto LAB_00252182;
    }
    uVar4 = (uint)(uVar12 >> 3);
    if ((uVar4 == 0) || (puVar9 <= puVar16)) {
switchD_00251ffc_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      local_68.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar12 & 7) {
      case 0:
        puVar11 = (uint *)0x0;
        bVar10 = puVar16 >= puVar9;
        if (puVar16 < puVar9) {
          in_R11 = (uint *)((long)puVar16 + 1);
          puVar8 = (uint *)(ulong)((byte)*puVar16 & 0x7f);
          puVar13 = puVar8;
          uVar15 = 0;
          if ((char)(byte)*puVar16 < '\0') {
            puVar13 = (uint *)0x0;
            uVar15 = 0;
            lVar7 = 7;
            puVar17 = in_R11;
            do {
              bVar18 = 0x38 < lVar7 - 7U;
              bVar10 = bVar18 || puVar9 <= puVar17;
              if (bVar18 || puVar9 <= puVar17) goto LAB_00252188;
              uVar2 = *puVar17;
              puVar17 = (uint *)((long)puVar17 + 1);
              puVar8 = (uint *)((ulong)puVar8 | (ulong)((byte)uVar2 & 0x7f) << ((byte)lVar7 & 0x3f))
              ;
              lVar7 = lVar7 + 7;
            } while ((char)(byte)uVar2 < '\0');
            puVar13 = (uint *)((ulong)puVar8 & 0xffffffff);
            in_R11 = puVar17;
            uVar15 = (uint)((ulong)puVar8 >> 0x20);
          }
        }
        else {
          puVar13 = (uint *)0x0;
          uVar15 = 0;
        }
LAB_00252188:
        puVar8 = (uint *)(ulong)uVar15;
        if (bVar10) {
          in_R11 = puVar16;
          puVar8 = puVar11;
          puVar13 = puVar11;
        }
        local_58 = puVar16;
        local_40 = (uint *)raw;
        if (in_R11 != puVar16) goto LAB_002521b0;
        uVar12 = 0;
        bVar10 = false;
        local_68.int_value_ = (uint64_t)puVar11;
        goto LAB_002521f2;
      case 1:
        in_R11 = puVar16 + 2;
        if (puVar9 < in_R11) {
LAB_00252182:
          uVar12 = 0;
          bVar10 = false;
          local_68.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_002521f2;
        }
        puVar13 = *(uint **)puVar16;
        puVar8 = (uint *)((ulong)puVar13 >> 0x20);
        break;
      case 2:
        bVar10 = puVar16 >= puVar9;
        puVar8 = local_50;
        if (puVar16 < puVar9) {
          bVar1 = (byte)*puVar16;
          puVar11 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar13 = (uint *)((long)puVar16 + 1U);
          for (; (in_R11 = puVar13, puVar8 = puVar11, (char)bVar1 < '\0' &&
                 (bVar18 = 0x38 < lVar7 - 7U, bVar10 = bVar18 || puVar9 <= puVar13,
                 in_R11 = (uint *)((long)puVar16 + 1U), puVar8 = local_50,
                 !bVar18 && puVar9 > puVar13)); lVar7 = lVar7 + 7) {
            bVar1 = (byte)*puVar13;
            puVar13 = (uint *)((long)puVar13 + 1);
            puVar11 = (uint *)((ulong)puVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f));
          }
        }
        local_50 = puVar8;
        if (bVar10) {
          in_R11 = puVar16;
          local_50 = (uint *)0x0;
        }
        if ((in_R11 == puVar16) || ((uint *)((long)puVar9 - (long)in_R11) < local_50)) {
          puVar8 = (uint *)0x0;
          puVar13 = (uint *)0x0;
          bVar10 = false;
          puVar11 = (uint *)0x0;
        }
        else {
          puVar8 = (uint *)((ulong)in_R11 >> 0x20);
          puVar13 = (uint *)((ulong)in_R11 & 0xffffffff);
          in_R11 = (uint *)((long)in_R11 + (long)local_50);
          bVar10 = true;
          puVar11 = local_50;
        }
        local_58 = puVar16;
        if (!bVar10) goto LAB_00252182;
        goto LAB_002521b0;
      default:
        goto switchD_00251ffc_caseD_3;
      case 5:
        in_R11 = puVar16 + 1;
        puVar8 = (uint *)0x0;
        if (puVar9 < in_R11) goto LAB_00252182;
        puVar13 = (uint *)(ulong)*puVar16;
      }
      puVar11 = (uint *)0x0;
LAB_002521b0:
      bVar10 = true;
      raw = in_R11;
      if ((uVar4 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
        local_68.int_value_ = (ulong)puVar13 & 0xffffffff | (long)puVar8 << 0x20;
        uVar12 = (ulong)puVar11 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        local_68.int_value_ = 0;
        uVar12 = 0;
      }
    }
LAB_002521f2:
    puVar16 = &switchD_00251ffc::switchdataD_0034e690;
    if (!bVar10) {
      local_68.size_ = (uint32_t)uVar12;
      local_68.type_ = (uint8_t)(uVar12 >> 0x30);
      local_68.id_ = (uint16_t)(uVar12 >> 0x20);
      local_48 = this;
      do {
        if (local_68.id_ == 0) {
          return puVar9 == (uint *)raw;
        }
        if ((ushort)(uVar12 >> 0x20) < 0x12) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar12 >> 0x20) & 0x3f);
        }
        uVar4 = ((uint)(uVar12 >> 0x20) & 0xffff) - 1;
        if (uVar4 < 0x11) {
          uVar3 = (*(code *)(&DAT_0034e6a8 + *(int *)(&DAT_0034e6a8 + (ulong)uVar4 * 4)))();
          return (bool)uVar3;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_68,local_38);
        do {
          if (puVar9 <= raw) goto LAB_00252686;
          uVar12 = (ulong)(char)(byte)*raw;
          puVar8 = (uint *)((long)raw + 1);
          if ((long)uVar12 < 0) {
            uVar5 = (ulong)((byte)*raw & 0x7f);
            bVar10 = false;
            uVar12 = uVar5;
            puVar13 = puVar8;
            if ((char)(byte)*raw < '\0') {
              lVar7 = 7;
              puVar11 = puVar8;
              do {
                bVar10 = 0x38 < lVar7 - 7U || puVar9 <= puVar11;
                uVar12 = 0;
                puVar13 = puVar8;
                if (bVar10) break;
                uVar4 = *puVar11;
                puVar13 = (uint *)((long)puVar11 + 1);
                uVar5 = uVar5 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar7 & 0x3f);
                lVar7 = lVar7 + 7;
                uVar12 = uVar5;
                puVar11 = puVar13;
              } while ((char)(byte)uVar4 < '\0');
            }
            puVar8 = puVar13;
            if (bVar10) {
              puVar8 = (uint *)raw;
              uVar12 = 0;
            }
            if (puVar8 == (uint *)raw) goto LAB_00252686;
          }
          uVar4 = (uint)(uVar12 >> 3);
          if ((uVar4 == 0) || (puVar9 <= puVar8)) {
switchD_002524cb_caseD_3:
            bVar10 = false;
            uVar12 = 0;
            local_68.int_value_ = (uint64_t)(uint *)0x0;
          }
          else {
            switch((uint)uVar12 & 7) {
            case 0:
              puVar17 = (uint *)0x0;
              bVar10 = puVar8 >= puVar9;
              if (puVar8 < puVar9) {
                puVar13 = (uint *)((long)puVar8 + 1);
                uVar15 = (byte)*puVar8 & 0x7f;
                uVar5 = (ulong)uVar15;
                puVar11 = (uint *)(ulong)uVar15;
                puVar16 = puVar13;
                uVar15 = 0;
                if ((char)(byte)*puVar8 < '\0') {
                  puVar11 = (uint *)0x0;
                  lVar7 = 7;
                  puVar14 = puVar13;
                  do {
                    bVar18 = 0x38 < lVar7 - 7U;
                    bVar10 = bVar18 || puVar9 <= puVar14;
                    puVar16 = puVar13;
                    uVar15 = 0;
                    if (bVar18 || puVar9 <= puVar14) break;
                    bVar1 = (byte)*puVar14;
                    puVar14 = (uint *)((long)puVar14 + 1);
                    uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
                    lVar7 = lVar7 + 7;
                    if (-1 < (char)bVar1) {
                      puVar11 = (uint *)(uVar5 & 0xffffffff);
                    }
                    puVar16 = puVar14;
                    uVar15 = (uint)(uVar5 >> 0x20);
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                puVar11 = (uint *)0x0;
                uVar15 = 0;
              }
              if (bVar10) {
                puVar11 = puVar17;
              }
              puVar13 = (uint *)(ulong)uVar15;
              if (bVar10) {
                puVar16 = puVar8;
                puVar13 = puVar17;
              }
              this = local_48;
              local_50 = puVar8;
              local_40 = (uint *)raw;
              if (puVar16 != puVar8) goto LAB_002526b2;
              uVar12 = 0;
              bVar10 = false;
              local_68.int_value_ = (uint64_t)puVar17;
              goto LAB_002526fd;
            case 1:
              puVar16 = puVar8 + 2;
              if (puVar9 < puVar16) {
LAB_00252686:
                uVar12 = 0;
                bVar10 = false;
                local_68.int_value_ = (uint64_t)(uint *)0x0;
                goto LAB_002526fd;
              }
              puVar11 = *(uint **)puVar8;
              puVar13 = (uint *)((ulong)puVar11 >> 0x20);
              break;
            case 2:
              bVar10 = puVar8 >= puVar9;
              puVar13 = local_58;
              if (puVar8 < puVar9) {
                puVar11 = (uint *)((long)puVar8 + 1);
                puVar17 = (uint *)(ulong)((byte)*puVar8 & 0x7f);
                puVar16 = puVar11;
                puVar13 = puVar17;
                if ((char)(byte)*puVar8 < '\0') {
                  lVar7 = 7;
                  puVar14 = puVar11;
                  do {
                    bVar10 = 0x38 < lVar7 - 7U || puVar9 <= puVar14;
                    puVar16 = puVar11;
                    puVar13 = local_58;
                    if (bVar10) break;
                    uVar15 = *puVar14;
                    puVar14 = (uint *)((long)puVar14 + 1);
                    puVar17 = (uint *)((ulong)puVar17 |
                                      (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar7 & 0x3f));
                    lVar7 = lVar7 + 7;
                    puVar16 = puVar14;
                    puVar13 = puVar17;
                  } while ((char)(byte)uVar15 < '\0');
                }
              }
              local_58 = puVar13;
              puVar11 = (uint *)0x0;
              if (bVar10) {
                puVar16 = puVar8;
                local_58 = puVar11;
              }
              if (puVar16 == puVar8) {
                puVar13 = (uint *)0x0;
                bVar10 = false;
                puVar17 = (uint *)0x0;
              }
              else if ((uint *)((long)puVar9 - (long)puVar16) < local_58) {
                puVar11 = (uint *)0x0;
                puVar13 = (uint *)0x0;
                bVar10 = false;
                puVar17 = (uint *)0x0;
              }
              else {
                puVar13 = (uint *)((ulong)puVar16 >> 0x20);
                puVar11 = (uint *)((ulong)puVar16 & 0xffffffff);
                puVar16 = (uint *)((long)puVar16 + (long)local_58);
                bVar10 = true;
                puVar17 = local_58;
              }
              this = local_48;
              if (!bVar10) goto LAB_00252686;
              goto LAB_002526b2;
            default:
              goto switchD_002524cb_caseD_3;
            case 5:
              puVar16 = puVar8 + 1;
              puVar13 = (uint *)0x0;
              if (puVar9 < puVar16) goto LAB_00252686;
              puVar11 = (uint *)(ulong)*puVar8;
            }
            puVar17 = (uint *)0x0;
LAB_002526b2:
            bVar10 = true;
            raw = puVar16;
            if ((uVar4 < 0x10000) && (puVar17 < (uint *)0x10000000)) {
              local_68.int_value_ = (ulong)puVar11 & 0xffffffff | (long)puVar13 << 0x20;
              uVar12 = (ulong)puVar17 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
              bVar10 = false;
            }
            else {
              local_68.int_value_ = 0;
              uVar12 = 0;
            }
          }
LAB_002526fd:
        } while (bVar10);
        local_68.size_ = (uint32_t)uVar12;
        local_68.type_ = (uint8_t)(uVar12 >> 0x30);
        local_68.id_ = (uint16_t)(uVar12 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool ChromeCompositorSchedulerState::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* state_machine */:
        (*state_machine_).ParseFromArray(field.data(), field.size());
        break;
      case 2 /* observing_begin_frame_source */:
        field.get(&observing_begin_frame_source_);
        break;
      case 3 /* begin_impl_frame_deadline_task */:
        field.get(&begin_impl_frame_deadline_task_);
        break;
      case 4 /* pending_begin_frame_task */:
        field.get(&pending_begin_frame_task_);
        break;
      case 5 /* skipped_last_frame_missed_exceeded_deadline */:
        field.get(&skipped_last_frame_missed_exceeded_deadline_);
        break;
      case 7 /* inside_action */:
        field.get(&inside_action_);
        break;
      case 8 /* deadline_mode */:
        field.get(&deadline_mode_);
        break;
      case 9 /* deadline_us */:
        field.get(&deadline_us_);
        break;
      case 10 /* deadline_scheduled_at_us */:
        field.get(&deadline_scheduled_at_us_);
        break;
      case 11 /* now_us */:
        field.get(&now_us_);
        break;
      case 12 /* now_to_deadline_delta_us */:
        field.get(&now_to_deadline_delta_us_);
        break;
      case 13 /* now_to_deadline_scheduled_at_delta_us */:
        field.get(&now_to_deadline_scheduled_at_delta_us_);
        break;
      case 14 /* begin_impl_frame_args */:
        (*begin_impl_frame_args_).ParseFromArray(field.data(), field.size());
        break;
      case 15 /* begin_frame_observer_state */:
        (*begin_frame_observer_state_).ParseFromArray(field.data(), field.size());
        break;
      case 16 /* begin_frame_source_state */:
        (*begin_frame_source_state_).ParseFromArray(field.data(), field.size());
        break;
      case 17 /* compositor_timing_history */:
        (*compositor_timing_history_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}